

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O2

exr_context_t createDummyFile(char *test)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  char *func;
  char *pcStack_90;
  exr_context_t f;
  char local_78 [16];
  code *pcStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  code *local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  f = (exr_context_t)0x0;
  func = local_78;
  uStack_18 = 0;
  uStack_38 = 0;
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  local_30 = 0;
  uStack_28 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_78[0] = 'h';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_20 = 0xbf800000fffffffe;
  local_40 = dummy_write;
  pcStack_68 = failable_malloc;
  iVar1 = exr_start_write(&f,test,0);
  if (iVar1 == 0) {
    func = (char *)0x0;
    iVar1 = exr_add_part(f,"dummy",0);
    if (iVar1 == 0) {
      return f;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "exr_add_part (f, \"dummy\", EXR_STORAGE_SCANLINE, __null)";
    pcStack_90 = (char *)0x58;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar3 = "exr_start_write (&f, test, EXR_WRITE_FILE_DIRECTLY, &cinit)";
    pcStack_90 = (char *)0x57;
  }
  core_test_fail(pcVar3,pcStack_90,0x151265,func);
}

Assistant:

static exr_context_t
createDummyFile (const char* test)
{
    exr_context_t             f     = NULL;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;

    // we won't actually write to this and so don't need a proper
    // stream but need a writable context to test with.
    cinit.write_fn = dummy_write;
    cinit.alloc_fn = failable_malloc;

    EXRCORE_TEST_RVAL (
        exr_start_write (&f, test, EXR_WRITE_FILE_DIRECTLY, &cinit));
    EXRCORE_TEST_RVAL (exr_add_part (f, "dummy", EXR_STORAGE_SCANLINE, NULL));
    return f;
}